

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O3

void __thiscall Func::InitializeEquivalentTypeGuard(Func *this,JitEquivalentTypeGuard *guard)

{
  RealCount *pRVar1;
  EquivalentTypeGuardList *pEVar2;
  EquivalentTypeCache *pEVar3;
  Type pSVar4;
  
  pEVar3 = (EquivalentTypeCache *)
           new<NativeCodeData::AllocatorNoFixup<Js::EquivalentTypeCache>>
                     (0x60,(AllocatorNoFixup<Js::EquivalentTypeCache> *)
                           &this->topFunc->transferDataAllocator,0x42c036);
  pEVar3->nextEvictionVictim = 8;
  guard->cache = pEVar3;
  pEVar3->guard = (PropertyGuard *)guard;
  pEVar2 = this->equivalentTypeGuards;
  pSVar4 = (Type)new<Memory::ArenaAllocator>
                           (0x10,(pEVar2->
                                 super_SList<Js::JitEquivalentTypeGuard_*,_Memory::ArenaAllocator,_RealCount>
                                 ).allocator,0x364470);
  pSVar4[1].next = (Type)guard;
  pSVar4->next = (pEVar2->
                 super_SList<Js::JitEquivalentTypeGuard_*,_Memory::ArenaAllocator,_RealCount>).
                 super_SListBase<Js::JitEquivalentTypeGuard_*,_Memory::ArenaAllocator,_RealCount>.
                 super_SListNodeBase<Memory::ArenaAllocator>.next;
  (pEVar2->super_SList<Js::JitEquivalentTypeGuard_*,_Memory::ArenaAllocator,_RealCount>).
  super_SListBase<Js::JitEquivalentTypeGuard_*,_Memory::ArenaAllocator,_RealCount>.
  super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar4;
  pRVar1 = &(pEVar2->super_SList<Js::JitEquivalentTypeGuard_*,_Memory::ArenaAllocator,_RealCount>).
            super_SListBase<Js::JitEquivalentTypeGuard_*,_Memory::ArenaAllocator,_RealCount>.
            super_RealCount;
  pRVar1->count = pRVar1->count + 1;
  return;
}

Assistant:

void
Func::InitializeEquivalentTypeGuard(Js::JitEquivalentTypeGuard * guard)
{
    // If we want to hard code the address of the cache, we will need to go back to allocating it from the native code data allocator.
    // We would then need to maintain consistency (double write) to both the recycler allocated cache and the one on the heap.
    Js::EquivalentTypeCache* cache = nullptr;
    if (this->IsOOPJIT())
    {
        cache = JitAnewZ(this->m_alloc, Js::EquivalentTypeCache);
    }
    else
    {
        cache = NativeCodeDataNewZNoFixup(GetTransferDataAllocator(), Js::EquivalentTypeCache);
    }
    guard->SetCache(cache);

    // Give the cache a back-pointer to the guard so that the guard can be cleared at runtime if necessary.
    cache->SetGuard(guard);
    this->equivalentTypeGuards->Prepend(guard);
}